

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>::Resize
          (TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_> *this,int64_t newsize)

{
  long lVar1;
  long lVar2;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar3;
  undefined1 auVar4 [16];
  ostream *this_00;
  void *this_01;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong in_RSI;
  long in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t large;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *newstore;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *in_stack_ffffffffffffff20;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *this_02;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *in_stack_ffffffffffffff28;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar9;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *in_stack_ffffffffffffff30;
  TPZReference *pTVar10;
  ulong local_a8;
  ulong *local_90;
  long local_38;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar1 = *(long *)(in_RDI + 8);
      if (lVar1 != 0) {
        lVar2 = *(long *)(lVar1 + -8);
        for (lVar5 = lVar1 + lVar2 * 8; lVar1 != lVar5; lVar5 = lVar5 + -8) {
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                    (in_stack_ffffffffffffff20);
        }
        operator_delete__((void *)(lVar1 + -8),lVar2 * 8 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = in_RSI;
      uVar6 = SUB168(auVar4 * ZEXT816(8),0);
      uVar8 = uVar6 + 8;
      if (SUB168(auVar4 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar6) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar7 = (ulong *)operator_new__(uVar8);
      *puVar7 = in_RSI;
      puVar7 = puVar7 + 1;
      if (in_RSI != 0) {
        local_90 = puVar7;
        do {
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer
                    (in_stack_ffffffffffffff30);
          local_90 = local_90 + 1;
        } while (local_90 != puVar7 + in_RSI);
      }
      local_a8 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_a8 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_38 = 0; local_38 < (long)local_a8; local_38 = local_38 + 1) {
        TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      }
      if ((*(long *)(in_RDI + 8) != 0) &&
         (pTVar3 = *(TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> **)(in_RDI + 8),
         pTVar3 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0)) {
        pTVar9 = pTVar3 + -1;
        pTVar10 = pTVar3[-1].fRef;
        this_02 = pTVar3 + (long)pTVar10;
        while (pTVar3 != this_02) {
          this_02 = this_02 + -1;
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer(this_02);
        }
        operator_delete__(pTVar9,(long)pTVar10 * 8 + 8);
      }
      *(ulong **)(in_RDI + 8) = puVar7;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}